

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O2

void tcache_destroy(tsd_t *tsd,tcache_t *tcache,_Bool tsd_tcache)

{
  long *plVar1;
  tcache_slow_t *tcache_slow;
  arena_t *arena;
  rtree_ctx_t *rtree_ctx;
  void *pvVar2;
  _Bool _Var3;
  uint uVar4;
  uintptr_t key;
  size_t *key_00;
  undefined7 in_register_00000011;
  tcache_t *tcache_00;
  atomic_p_t arena_00;
  uintptr_t in_R8;
  rtree_t *prVar5;
  rtree_metadata_t rVar6;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_contents_t local_1c8;
  
  tcache_slow = tcache->tcache_slow;
  tcache_flush_cache(tsd,tcache);
  arena = tcache_slow->arena;
  tcache_arena_dissociate((tsdn_t *)tsd,tcache_slow,tcache_00);
  if ((int)CONCAT71(in_register_00000011,tsd_tcache) != 0) {
    _Var3 = duckdb_je_cache_bin_stack_use_thp();
    if (_Var3) {
      duckdb_je_b0_dalloc_tcache_stack((tsdn_t *)tsd,tcache_slow->dyn_alloc);
      goto LAB_00e77777;
    }
  }
  rtree_ctx = (rtree_ctx_t *)tcache_slow->dyn_alloc;
  if (tsd == (tsd_t *)0x0) {
    prVar5 = (rtree_t *)&stack0xfffffffffffffe50;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar5);
  }
  else {
    prVar5 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rtree_read(&local_1c8,(tsdn_t *)tsd,prVar5,rtree_ctx,in_R8);
  key = (uintptr_t)((uint)(local_1c8.edata)->e_bits & 0xfff);
  pvVar2 = duckdb_je_arenas[key].repr;
  if (tsd == (tsd_t *)0x0) {
    prVar5 = (rtree_t *)&stack0xfffffffffffffe50;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar5);
  }
  else {
    prVar5 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rVar6 = rtree_metadata_read((tsdn_t *)tsd,prVar5,rtree_ctx,key);
  key_00 = duckdb_je_sz_index2size_tab;
  LOCK();
  plVar1 = (long *)((long)pvVar2 + 0x48);
  *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[rVar6.szind];
  UNLOCK();
  if (tsd == (tsd_t *)0x0) {
    prVar5 = (rtree_t *)&stack0xfffffffffffffe50;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar5);
  }
  else {
    prVar5 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rVar6 = rtree_metadata_read((tsdn_t *)tsd,prVar5,rtree_ctx,(uintptr_t)key_00);
  if ((rVar6._8_4_ >> 8 & 1) == 0) {
    if (tsd == (tsd_t *)0x0) {
      prVar5 = (rtree_t *)&stack0xfffffffffffffe50;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar5);
    }
    else {
      prVar5 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rtree_read(&local_1c8,(tsdn_t *)tsd,prVar5,rtree_ctx,in_R8);
    duckdb_je_large_dalloc((tsdn_t *)tsd,local_1c8.edata);
  }
  else {
    duckdb_je_arena_dalloc_small((tsdn_t *)tsd,rtree_ctx);
  }
LAB_00e77777:
  arena_00.repr = duckdb_je_arenas[0].repr;
  if (duckdb_je_arenas[0].repr == (void *)0x0) {
    arena_00.repr = (arena_t *)0x0;
  }
  duckdb_je_arena_decay((tsdn_t *)tsd,(arena_t *)arena_00.repr,false,false);
  uVar4 = duckdb_je_arena_nthreads_get(arena,false);
  if ((uVar4 != 0) || (_Var3 = true, (duckdb_je_background_thread_enabled_state.repr & 1U) != 0)) {
    _Var3 = false;
  }
  duckdb_je_arena_decay((tsdn_t *)tsd,arena,false,_Var3);
  return;
}

Assistant:

static void
tcache_destroy(tsd_t *tsd, tcache_t *tcache, bool tsd_tcache) {
	tcache_slow_t *tcache_slow = tcache->tcache_slow;
	tcache_flush_cache(tsd, tcache);
	arena_t *arena = tcache_slow->arena;
	tcache_arena_dissociate(tsd_tsdn(tsd), tcache_slow, tcache);

	if (tsd_tcache) {
		cache_bin_t *cache_bin = &tcache->bins[0];
		cache_bin_assert_empty(cache_bin);
	}
	if (tsd_tcache && cache_bin_stack_use_thp()) {
		b0_dalloc_tcache_stack(tsd_tsdn(tsd), tcache_slow->dyn_alloc);
	} else {
		idalloctm(tsd_tsdn(tsd), tcache_slow->dyn_alloc, NULL, NULL,
		    true, true);
	}

	/*
	 * The deallocation and tcache flush above may not trigger decay since
	 * we are on the tcache shutdown path (potentially with non-nominal
	 * tsd).  Manually trigger decay to avoid pathological cases.  Also
	 * include arena 0 because the tcache array is allocated from it.
	 */
	arena_decay(tsd_tsdn(tsd), arena_get(tsd_tsdn(tsd), 0, false),
	    false, false);

	if (arena_nthreads_get(arena, false) == 0 &&
	    !background_thread_enabled()) {
		/* Force purging when no threads assigned to the arena anymore. */
		arena_decay(tsd_tsdn(tsd), arena,
		    /* is_background_thread */ false, /* all */ true);
	} else {
		arena_decay(tsd_tsdn(tsd), arena,
		    /* is_background_thread */ false, /* all */ false);
	}
}